

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O0

tnt_iter * tnt_iter_reply(tnt_iter *i,tnt_stream *s)

{
  tnt_iter_reply *ir;
  tnt_stream *s_local;
  tnt_iter *i_local;
  
  i_local = tnt_iter_init(i);
  if (i_local == (tnt_iter *)0x0) {
    i_local = (tnt_iter *)0x0;
  }
  else {
    i_local->type = TNT_ITER_REPLY;
    i_local->next = tnt_iter_reply_next;
    i_local->rewind = (_func_void_tnt_iter_ptr *)0x0;
    i_local->free = tnt_iter_reply_free;
    (i_local->data).reply.s = s;
    tnt_reply_init(&(i_local->data).reply.r);
  }
  return i_local;
}

Assistant:

struct tnt_iter *tnt_iter_reply(struct tnt_iter *i, struct tnt_stream *s) {
	i = tnt_iter_init(i);
	if (i == NULL)
		return NULL;
	i->type = TNT_ITER_REPLY;
	i->next = tnt_iter_reply_next;
	i->rewind = NULL;
	i->free = tnt_iter_reply_free;
	struct tnt_iter_reply *ir = TNT_IREPLY(i);
	ir->s = s;
	tnt_reply_init(&ir->r);
	return i;
}